

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_bddComputeCube(DdManager *dd,DdNode **bXVars,int nVars)

{
  DdNode *n;
  int local_34;
  int i;
  DdNode *bTemp;
  DdNode *bRes;
  int nVars_local;
  DdNode **bXVars_local;
  DdManager *dd_local;
  
  bTemp = dd->one;
  Cudd_Ref(bTemp);
  for (local_34 = 0; local_34 < nVars; local_34 = local_34 + 1) {
    n = Cudd_bddAnd(dd,bTemp,bXVars[local_34]);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,bTemp);
    bTemp = n;
  }
  Cudd_Deref(bTemp);
  return bTemp;
}

Assistant:

DdNode * Extra_bddComputeCube( DdManager * dd, DdNode ** bXVars, int nVars )
{
    DdNode * bRes;
    DdNode * bTemp;
    int i;

    bRes = b1; Cudd_Ref( bRes );
    for ( i = 0; i < nVars; i++ )
    {
        bRes = Cudd_bddAnd( dd, bTemp = bRes, bXVars[i] );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }

    Cudd_Deref( bRes );
    return bRes;
}